

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

void __thiscall re2::DFA::StateSaver::StateSaver(StateSaver *this,DFA *dfa,State *state)

{
  size_t __n;
  int iVar1;
  int *__dest;
  ulong uVar2;
  
  this->dfa_ = dfa;
  if ((State *)0x2 < state) {
    this->is_special_ = false;
    this->special_ = (State *)0x0;
    this->flag_ = state->flag_;
    iVar1 = state->ninst_;
    __n = (long)iVar1 * 4;
    this->ninst_ = iVar1;
    uVar2 = 0xffffffffffffffff;
    if (-1 < (long)iVar1) {
      uVar2 = __n;
    }
    __dest = (int *)operator_new__(uVar2);
    this->inst_ = __dest;
    memmove(__dest,state->inst_,__n);
    return;
  }
  this->inst_ = (int *)0x0;
  this->ninst_ = 0;
  this->flag_ = 0;
  this->is_special_ = true;
  this->special_ = state;
  return;
}

Assistant:

DFA::StateSaver::StateSaver(DFA* dfa, State* state) {
  dfa_ = dfa;
  if (state <= SpecialStateMax) {
    inst_ = NULL;
    ninst_ = 0;
    flag_ = 0;
    is_special_ = true;
    special_ = state;
    return;
  }
  is_special_ = false;
  special_ = NULL;
  flag_ = state->flag_;
  ninst_ = state->ninst_;
  inst_ = new int[ninst_];
  memmove(inst_, state->inst_, ninst_*sizeof inst_[0]);
}